

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

Attribute * Imf_2_5::TypedAttribute<Imf_2_5::ChannelList>::makeNewAttribute(void)

{
  TypedAttribute<Imf_2_5::ChannelList> *this;
  
  this = (TypedAttribute<Imf_2_5::ChannelList> *)operator_new(0x38);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  *(undefined8 *)&(this->_value)._map._M_t._M_impl = 0;
  *(undefined8 *)&(this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->_value)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  TypedAttribute(this);
  return &this->super_Attribute;
}

Assistant:

Attribute *
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T>();
}